

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O1

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Mat *pMVar4;
  size_t _elemsize;
  size_t sVar5;
  int *piVar6;
  pointer pMVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  void *pvVar19;
  float *pfVar20;
  float *pfVar21;
  char cVar22;
  long lVar23;
  ulong uVar24;
  char cVar25;
  long lVar26;
  ulong uVar27;
  undefined4 *puVar28;
  void *pvVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  float fVar36;
  Mat local_c8;
  Mat local_78;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  _elemsize = pMVar4->elemsize;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  if (this->transA == 0) {
    if (&local_c8 != pMVar4) {
      piVar6 = pMVar4->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      local_c8.data = pMVar4->data;
      local_c8.refcount._0_4_ = SUB84(pMVar4->refcount,0);
      local_c8.refcount._4_4_ = (undefined4)((ulong)pMVar4->refcount >> 0x20);
      local_c8.elemsize._0_4_ = (undefined4)pMVar4->elemsize;
      local_c8.elemsize._4_4_ = (undefined4)(pMVar4->elemsize >> 0x20);
      local_c8.elempack = pMVar4->elempack;
      local_c8.allocator = pMVar4->allocator;
      uVar8 = pMVar4->dims;
      uVar9 = pMVar4->w;
      uVar10 = pMVar4->h;
      uVar11 = pMVar4->d;
      local_c8.c = pMVar4->c;
      local_c8.cstep = pMVar4->cstep;
      local_c8.dims = uVar8;
      local_c8.w = uVar9;
      local_c8.h = uVar10;
      local_c8.d = uVar11;
    }
  }
  else {
    Mat::create(&local_c8,pMVar4->h,pMVar4->w,_elemsize,opt->workspace_allocator);
    if (0 < (long)local_c8.h) {
      lVar23 = 0;
      lVar26 = 0;
      pvVar19 = local_c8.data;
      do {
        if (0 < local_c8.w) {
          iVar1 = pMVar4->w;
          sVar5 = pMVar4->elemsize;
          puVar28 = (undefined4 *)((long)pMVar4->data + lVar23);
          uVar30 = 0;
          do {
            *(undefined4 *)((long)pvVar19 + uVar30 * 4) = *puVar28;
            uVar30 = uVar30 + 1;
            puVar28 = (undefined4 *)((long)puVar28 + (long)iVar1 * sVar5);
          } while ((uint)local_c8.w != uVar30);
        }
        lVar26 = lVar26 + 1;
        pvVar19 = (void *)((long)pvVar19 +
                          (long)local_c8.w *
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        lVar23 = lVar23 + 4;
      } while (lVar26 != local_c8.h);
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  if (this->transB == 0) {
    Mat::create(&local_78,pMVar4[1].h,pMVar4[1].w,_elemsize,opt->workspace_allocator);
    if (0 < (long)local_78.h) {
      lVar23 = 0;
      lVar26 = 0;
      pvVar19 = local_78.data;
      do {
        if (0 < local_78.w) {
          iVar1 = pMVar4[1].w;
          sVar5 = pMVar4[1].elemsize;
          puVar28 = (undefined4 *)((long)pMVar4[1].data + lVar23);
          uVar30 = 0;
          do {
            *(undefined4 *)((long)pvVar19 + uVar30 * 4) = *puVar28;
            uVar30 = uVar30 + 1;
            puVar28 = (undefined4 *)((long)puVar28 + (long)iVar1 * sVar5);
          } while ((uint)local_78.w != uVar30);
        }
        lVar26 = lVar26 + 1;
        pvVar19 = (void *)((long)pvVar19 +
                          (long)local_78.w *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
        lVar23 = lVar23 + 4;
      } while (lVar26 != local_78.h);
    }
  }
  else if (&local_78 != pMVar4 + 1) {
    piVar6 = pMVar4[1].refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_78.data = pMVar4[1].data;
    local_78.refcount._0_4_ = SUB84(pMVar4[1].refcount,0);
    local_78.refcount._4_4_ = (undefined4)((ulong)pMVar4[1].refcount >> 0x20);
    local_78.elemsize._0_4_ = (undefined4)pMVar4[1].elemsize;
    local_78.elemsize._4_4_ = (undefined4)(pMVar4[1].elemsize >> 0x20);
    local_78.elempack = pMVar4[1].elempack;
    local_78.allocator = pMVar4[1].allocator;
    uVar12 = pMVar4[1].dims;
    uVar13 = pMVar4[1].w;
    uVar14 = pMVar4[1].h;
    uVar15 = pMVar4[1].d;
    local_78.c = pMVar4[1].c;
    local_78.cstep = pMVar4[1].cstep;
    local_78.dims = uVar12;
    local_78.w = uVar13;
    local_78.h = uVar14;
    local_78.d = uVar15;
  }
  iVar17 = local_78.h;
  iVar16 = local_c8.h;
  iVar1 = local_c8.w;
  uVar30 = (ulong)(uint)local_c8.h;
  uVar32 = (ulong)(uint)local_78.h;
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar23 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar7;
  if (lVar23 == 0xd8) {
    uVar2 = pMVar7[2].w;
    bVar34 = uVar2 == local_c8.h && pMVar7[2].dims == 1;
    uVar3 = pMVar7[2].h;
    cVar22 = '\x02';
    if (uVar3 != local_c8.h) {
      cVar22 = bVar34;
    }
    if (uVar2 != 1) {
      cVar22 = bVar34;
    }
    bVar35 = pMVar7[2].dims != 2;
    if (bVar35) {
      cVar22 = bVar34;
    }
    cVar25 = '\x03';
    if (uVar3 != local_c8.h) {
      cVar25 = cVar22;
    }
    if (bVar35 || uVar2 != local_78.h) {
      cVar25 = cVar22;
    }
    cVar22 = '\x04';
    if (uVar3 != 1) {
      cVar22 = cVar25;
    }
    pfVar21 = (float *)pMVar7[2].data;
    if (bVar35 || uVar2 != local_78.h) {
      cVar22 = cVar25;
    }
  }
  else {
    pfVar21 = (float *)0x0;
    cVar22 = '\0';
  }
  uVar33 = (ulong)(uint)local_c8.w;
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar4,local_78.h,local_c8.h,_elemsize,opt->blob_allocator);
  pfVar20 = (float *)pMVar4->data;
  iVar18 = -100;
  if ((pfVar20 != (float *)0x0) && ((long)pMVar4->c * pMVar4->cstep != 0)) {
    if (0 < iVar16) {
      uVar27 = 0;
      pvVar19 = local_c8.data;
      do {
        if (0 < iVar17) {
          uVar31 = 0;
          pvVar29 = local_78.data;
          do {
            fVar36 = 0.0;
            if (lVar23 == 0xd8) {
              if (cVar22 == '\0') {
                fVar36 = *pfVar21;
              }
              if (cVar22 == '\x01') {
                fVar36 = pfVar21[uVar27];
              }
              if (cVar22 == '\x02') {
                fVar36 = pfVar21[uVar27];
              }
              if (cVar22 == '\x03') {
                fVar36 = pfVar21[uVar31 + uVar27 * uVar32];
              }
              if (cVar22 == '\x04') {
                fVar36 = pfVar21[uVar31];
              }
              fVar36 = fVar36 * this->beta;
            }
            if (0 < iVar1) {
              uVar24 = 0;
              do {
                fVar36 = fVar36 + *(float *)((long)pvVar29 + uVar24 * 4) *
                                  *(float *)((long)pvVar19 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar33 != uVar24);
            }
            *pfVar20 = fVar36 * this->alpha;
            pfVar20 = pfVar20 + 1;
            uVar31 = uVar31 + 1;
            pvVar29 = (void *)((long)pvVar29 +
                              (long)local_78.w *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar31 != uVar32);
        }
        uVar27 = uVar27 + 1;
        pvVar19 = (void *)((long)pvVar19 +
                          (long)local_c8.w *
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
      } while (uVar27 != uVar30);
    }
    iVar18 = 0;
  }
  piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = bottom_blobs[0];
    const Mat& B0 = bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create(A0.h, A0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0.row(j)[i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create(B0.h, B0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0.row(j)[i];
            }
        }
    }
    else
    {
        B = B0;
    }

    int M = A.h;
    int K = A.w; // assert A.w == B.w
    int N = B.h;

    bool has_C = bottom_blobs.size() == 3;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (has_C)
    {
        const Mat& C = bottom_blobs[2];

        ptrC = C;

        if (C.dims == 1 && C.w == 1)
        {
            // scalar
            broadcast_type_C = 0;
        }
        if (C.dims == 1 && C.w == M)
        {
            // M
            // auto broadcast from h to w is the ncnn-style convention
            broadcast_type_C = 1;
        }
        if (C.dims == 2 && C.w == 1 && C.h == M)
        {
            // Mx1
            broadcast_type_C = 2;
        }
        if (C.dims == 2 && C.w == N && C.h == M)
        {
            // MxN
            broadcast_type_C = 3;
        }
        if (C.dims == 2 && C.w == N && C.h == 1)
        {
            // 1xN
            broadcast_type_C = 4;
        }
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(N, M, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* outptr = top_blob;
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = A.row(i);

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = B.row(j);

            float sum = 0.f;
            if (has_C)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum * alpha;
        }
    }

    return 0;
}